

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void AR30ToAB30Row_C(uint8_t *src_ar30,uint8_t *dst_ab30,int width)

{
  uint uVar1;
  uint32_t r;
  uint32_t ga;
  uint32_t b;
  uint32_t ar30;
  int x;
  int width_local;
  uint8_t *dst_ab30_local;
  uint8_t *src_ar30_local;
  
  dst_ab30_local = dst_ab30;
  src_ar30_local = src_ar30;
  for (x = 0; x < width; x = x + 1) {
    uVar1 = *(uint *)src_ar30_local;
    *(uint *)dst_ab30_local = uVar1 >> 0x14 & 0x3ff | uVar1 & 0xc00ffc00 | (uVar1 & 0x3ff) << 0x14;
    dst_ab30_local = dst_ab30_local + 4;
    src_ar30_local = src_ar30_local + 4;
  }
  return;
}

Assistant:

void AR30ToAB30Row_C(const uint8_t* src_ar30, uint8_t* dst_ab30, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint32_t ar30;
    memcpy(&ar30, src_ar30, sizeof ar30);
    uint32_t b = ar30 & 0x3ff;
    uint32_t ga = ar30 & 0xc00ffc00;
    uint32_t r = (ar30 >> 20) & 0x3ff;
    *(uint32_t*)(dst_ab30) = r | ga | (b << 20);
    dst_ab30 += 4;
    src_ar30 += 4;
  }
}